

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZBSpStructMatrix.cpp
# Opt level: O3

TPZMatrix<std::complex<double>_> * __thiscall
TPZBSpStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>::Create
          (TPZBSpStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_> *this
          )

{
  TPZEquationFilter *this_00;
  int iVar1;
  int iVar2;
  TNode *pTVar3;
  long lVar4;
  TPZFYsmpMatrix<std::complex<double>_> *this_01;
  int64_t iVar5;
  void *pvVar6;
  void *pvVar7;
  void *__s;
  int64_t iVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long minindex;
  long lVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  bool bVar18;
  TPZVec<long> elgraphindex;
  TPZRenumbering metis;
  TPZManVector<long,_10> nodegraphindex;
  TPZManVector<long,_10> nodegraph;
  TPZStack<long,_10> elgraph;
  TPZVec<long> local_220;
  TPZRenumbering local_200;
  TPZManVector<long,_10> local_180;
  TPZManVector<long,_10> local_110;
  TPZManVector<long,_10> local_a0;
  
  lVar4 = (**(code **)(*(long *)(this->
                                super_TPZSpStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
                                ).super_TPZStructMatrixT<std::complex<double>_>.
                                super_TPZStructMatrix.fMesh + 0x98))();
  if (lVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "TPZSpStructMatrix should not be called with CreateAssemble for a substructure mesh\n"
               ,0x53);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/StrMatrix/TPZBSpStructMatrix.cpp"
               ,0x1a);
  }
  iVar5 = (&(this->
            super_TPZSpStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
            ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix.fEquationFilter.
            fNumEq)[(ulong)(this->
                           super_TPZSpStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
                           ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix.
                           fEquationFilter.fIsActive * 4];
  this_01 = (TPZFYsmpMatrix<std::complex<double>_> *)operator_new(0x3e0);
  TPZFYsmpMatrix<std::complex<double>_>::TPZFYsmpMatrix(this_01,iVar5,iVar5);
  TPZStack<long,_10>::TPZStack((TPZStack<long,_10> *)&local_a0);
  local_220._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
  local_220.fStore = (long *)0x0;
  local_220.fNElements = 0;
  local_220.fNAlloc = 0;
  TPZCompMesh::ComputeElGraph
            ((this->
             super_TPZSpStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
             ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix.fMesh,
             (TPZStack<long,_10> *)&local_a0,&local_220);
  iVar5 = local_220.fNElements;
  local_200.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZRenumbering_018bf638;
  local_200.fNElements = 0;
  local_200.fNNodes = 0;
  local_200.fNodeWeights._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
  local_200.fNodeWeights.fStore = (int *)0x0;
  local_200.fNodeWeights.fNElements = 0;
  local_200.fNodeWeights.fNAlloc = 0;
  local_200.fElementGraph._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
  local_200.fElementGraph.fStore = (long *)0x0;
  local_200.fElementGraph.fNElements = 0;
  local_200.fElementGraph.fNAlloc = 0;
  local_200.fElementGraphIndex._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
  local_200.fElementGraphIndex.fStore = (long *)0x0;
  local_200.fElementGraphIndex.fNElements = 0;
  local_200.fElementGraphIndex.fNAlloc = 0;
  local_200.fNNodes =
       TPZCompMesh::NIndependentConnects
                 ((this->
                  super_TPZSpStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
                  ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix.fMesh);
  local_200.fNElements = iVar5 + -1;
  TPZRenumbering::SetElementGraph(&local_200,&local_a0.super_TPZVec<long>,&local_220);
  TPZManVector<long,_10>::TPZManVector(&local_110,0);
  TPZManVector<long,_10>::TPZManVector(&local_180,0);
  TPZRenumbering::ConvertGraph
            (&local_200,&local_a0.super_TPZVec<long>,&local_220,&local_110,&local_180);
  this_00 = &(this->
             super_TPZSpStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
             ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix.fEquationFilter;
  if (local_180.super_TPZVec<long>.fNElements < 2) {
    uVar10 = 1;
    lVar4 = 0;
  }
  else {
    lVar4 = 0;
    lVar9 = 0;
    lVar17 = 0;
    do {
      pTVar3 = (((this->
                 super_TPZSpStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
                 ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix.fMesh)->
               fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
      lVar14 = (long)pTVar3[(int)lVar17].dim;
      lVar12 = (long)pTVar3[(int)lVar17].pos;
      iVar5 = TPZEquationFilter::NumActive(this_00,lVar12,lVar12 + lVar14);
      if (iVar5 != 0) {
        if (iVar5 != lVar14) {
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/StrMatrix/TPZBSpStructMatrix.cpp"
                     ,0x43);
        }
        lVar9 = lVar9 + lVar14;
        lVar12 = local_180.super_TPZVec<long>.fStore[lVar17];
        lVar13 = local_180.super_TPZVec<long>.fStore[lVar17 + 1];
        lVar4 = lVar14 * lVar14 + lVar4;
        if (lVar12 < lVar13) {
          do {
            pTVar3 = (((this->
                       super_TPZSpStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
                       ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix.fMesh)
                     ->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
            lVar11 = (long)pTVar3[(int)local_110.super_TPZVec<long>.fStore[lVar12]].dim;
            minindex = (long)pTVar3[(int)local_110.super_TPZVec<long>.fStore[lVar12]].pos;
            iVar5 = TPZEquationFilter::NumActive(this_00,minindex,minindex + lVar11);
            lVar11 = lVar11 * lVar14;
            if (iVar5 == 0) {
              lVar11 = 0;
            }
            lVar4 = lVar4 + lVar11;
            lVar12 = lVar12 + 1;
          } while (lVar13 != lVar12);
        }
      }
      bVar18 = lVar17 != local_180.super_TPZVec<long>.fNElements + -2;
      lVar17 = lVar17 + 1;
    } while (bVar18);
    uVar10 = lVar9 + 1;
  }
  iVar5 = TPZCompMesh::NIndependentConnects
                    ((this->
                     super_TPZSpStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
                     ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix.fMesh);
  pvVar6 = operator_new__(-(ulong)(uVar10 >> 0x3d != 0) | uVar10 << 3);
  uVar15 = lVar4 / 2;
  uVar10 = 0xffffffffffffffff;
  if (uVar15 < 0x2000000000000000) {
    uVar10 = uVar15 * 8;
  }
  pvVar7 = operator_new__(uVar10);
  __s = operator_new__(-(ulong)(uVar15 >> 0x3c != 0) | uVar15 << 4);
  if (2 < lVar4 + 1U) {
    memset(__s,0,uVar15 << 4);
  }
  if (iVar5 < 1) {
    lVar4 = 0;
    uVar10 = 0;
  }
  else {
    lVar17 = 0;
    uVar10 = 0;
    lVar4 = 0;
    do {
      iVar16 = (int)lVar17;
      pTVar3 = (((this->
                 super_TPZSpStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
                 ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix.fMesh)->
               fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
      iVar1 = pTVar3[iVar16].dim;
      lVar9 = (long)pTVar3[iVar16].pos;
      iVar8 = TPZEquationFilter::NumActive(this_00,lVar9,iVar1 + lVar9);
      if ((iVar8 != 0) && (0 < iVar1)) {
        lVar9 = 0;
        do {
          *(long *)((long)pvVar6 + uVar10 * 8) = lVar4;
          if ((uVar10 & 1) == 0) {
            lVar12 = (long)(((this->
                             super_TPZSpStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
                             ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix.
                            fMesh)->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore[iVar16].dim;
            if (0 < lVar12) {
              memset((void *)((long)pvVar7 + lVar4 * 8),0xff,lVar12 * 8);
              memset((void *)(lVar4 * 0x10 + (long)__s),0,lVar12 << 4);
              lVar4 = lVar4 + lVar12;
            }
            lVar12 = local_180.super_TPZVec<long>.fStore[lVar17];
            lVar14 = local_180.super_TPZVec<long>.fStore[lVar17 + 1];
            if (lVar12 < lVar14) {
              do {
                pTVar3 = (((this->
                           super_TPZSpStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
                           ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix.
                          fMesh)->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
                iVar2 = pTVar3[(int)local_110.super_TPZVec<long>.fStore[lVar12]].dim;
                lVar11 = (long)iVar2;
                lVar13 = (long)pTVar3[(int)local_110.super_TPZVec<long>.fStore[lVar12]].pos;
                iVar8 = TPZEquationFilter::NumActive(this_00,lVar13,lVar13 + lVar11);
                if ((iVar8 != 0) && (0 < iVar2)) {
                  memset((void *)((long)pvVar7 + lVar4 * 8),0xff,lVar11 * 8);
                  memset((void *)(lVar4 * 0x10 + (long)__s),0,lVar11 << 4);
                  lVar4 = lVar4 + lVar11;
                }
                lVar12 = lVar12 + 1;
              } while (lVar14 != lVar12);
            }
            uVar10 = uVar10 | 1;
          }
          else {
            uVar10 = uVar10 + 1;
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 != iVar1);
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 != iVar5);
  }
  *(long *)((long)pvVar6 + uVar10 * 8) = lVar4;
  (*(this_01->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable[0x50])(this_01,pvVar6,pvVar7,__s);
  TPZManVector<long,_10>::~TPZManVector(&local_180);
  TPZManVector<long,_10>::~TPZManVector(&local_110);
  TPZRenumbering::~TPZRenumbering(&local_200,&TPZRenumbering::VTT);
  local_220._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
  if (local_220.fStore != (long *)0x0) {
    operator_delete__(local_220.fStore);
  }
  TPZManVector<long,_10>::~TPZManVector(&local_a0);
  return &this_01->super_TPZMatrix<std::complex<double>_>;
}

Assistant:

TPZMatrix<TVar> * TPZBSpStructMatrix<TVar,TPar>::Create(){
    //checked
    if(this->fMesh->FatherMesh()) {
		PZError << "TPZSpStructMatrix should not be called with CreateAssemble for a substructure mesh\n";
        DebugStop();
    }
    int64_t neq = this->fEquationFilter.NActiveEquations();
    TPZFYsmpMatrix<TVar> * mat = new TPZFYsmpMatrix<TVar>(neq,neq);
	
    /**Rearange elements order*/
	//    TPZVec<int> elorder(fMesh->NEquations(),0);
	
	
    /**
     *Longhin implementation
	 */
    TPZStack<int64_t> elgraph;
    TPZVec<int64_t> elgraphindex;
	//    int nnodes = 0;
    this->fMesh->ComputeElGraph(elgraph,elgraphindex);
    /**Creates a element graph*/
    TPZRenumbering metis;
    metis.SetElementsNodes(elgraphindex.NElements() -1 ,this->fMesh->NIndependentConnects());
    metis.SetElementGraph(elgraph,elgraphindex);
	
    TPZManVector<int64_t> nodegraph;
    TPZManVector<int64_t> nodegraphindex;
    /**
     *converts an element graph structure into a node graph structure
     *those vectors have size ZERO !!!
     */
    metis.ConvertGraph(elgraph,elgraphindex,nodegraph,nodegraphindex);
    /**vector sizes*/
    int64_t i;
    int64_t nblock = nodegraphindex.NElements()-1;
    int64_t totalvar = 0;
    int64_t totaleq = 0;
    for(i=0;i<nblock;i++){
		int64_t iblsize = this->fMesh->Block().Size(i);
		int64_t iblpos = this->fMesh->Block().Position(i);
        int64_t numactive = this->fEquationFilter.NumActive(iblpos, iblpos+iblsize);
        if (!numactive) {
            continue;
        }
        if (numactive != iblsize) {
            DebugStop();
        }
		totaleq += iblsize;
		int64_t icfirst = nodegraphindex[i];
		int64_t iclast = nodegraphindex[i+1];
		int64_t j;
		//longhin
		totalvar+=iblsize*iblsize;
		for(j=icfirst;j<iclast;j++) {
			int64_t col = nodegraph[j];
			int64_t colsize = this->fMesh->Block().Size(col);
			int64_t colpos = this->fMesh->Block().Position(col);
            int64_t numactive = this->fEquationFilter.NumActive(colpos, colpos+colsize);
            if (!numactive) {
                continue;
            }
			totalvar += iblsize*colsize;
		}
    }
	
    int64_t ieq = 0;
    int64_t pos = 0;
	
    nblock=this->fMesh->NIndependentConnects();
	
    int64_t * Eq = new int64_t[totaleq+1];
    int64_t * EqCol = new int64_t[totalvar/2];
    TVar * EqValue = new TVar[totalvar/2];
    for(i=0;i<nblock;i++){
		int64_t iblsize = this->fMesh->Block().Size(i);
		int64_t iblpos = this->fMesh->Block().Position(i);
        int64_t numactive = this->fEquationFilter.NumActive(iblpos, iblpos+iblsize);
        if (!numactive) {
            continue;
        }
		int64_t ibleq;
		for(ibleq=0; ibleq<iblsize; ibleq++) {
			Eq[ieq] = pos;
			if(ieq%2) {
				ieq++;
				continue;
			}
			int64_t colsize = this->fMesh->Block().Size(i);
			int64_t colpos = this->fMesh->Block().Position(i);
			int64_t jbleq;
			for(jbleq=0; jbleq<colsize; jbleq++) {
				/**It can also be implemented using half the size of both columns and data vectors*/
				EqCol[pos] = -1;//colpos;
				EqValue[pos] = 0.;
				colpos++;
				pos++;
			}
			
			int64_t icfirst = nodegraphindex[i];
			int64_t iclast = nodegraphindex[i+1];
			int64_t j;
			for(j=icfirst;j<iclast;j++) {
				int64_t col = nodegraph[j];
				colsize = this->fMesh->Block().Size(col);
				colpos = this->fMesh->Block().Position(col);
                int64_t numactive = this->fEquationFilter.NumActive(colpos, colpos+colsize);
                if (!numactive) {
                    continue;
                }
                for(jbleq=0; jbleq<colsize; jbleq++) {
					EqCol[pos] = -1;//colpos;
					EqValue[pos] = 0.;
					colpos++;
					pos++;
				}
			}
			ieq++;
		}
    }
    Eq[ieq] = pos;
	/*    for(i=0;i<totalvar;i++){
	 if(i<totaleq+1){
	 cout << i <<  " " << Eq[i] << " "<< EqCol[i] << " " << EqValue[i] << endl;
	 }else{
	 cout << i <<  " " << " "<< EqCol[i] << " " << EqValue[i] << endl;
	 }
	 }
	 */
    mat->SetData(Eq,EqCol,EqValue);
    return mat;
}